

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O2

UBool __thiscall icu_63::RuleBasedTimeZone::operator==(RuleBasedTimeZone *this,TimeZone *that)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  UBool UVar4;
  
  UVar4 = '\x01';
  if ((this != (RuleBasedTimeZone *)that) &&
     ((((bVar1 = std::type_info::operator!=
                           ((type_info *)
                            (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
                            [-1],(type_info *)(that->super_UObject)._vptr_UObject[-1]), bVar1 ||
        (UVar2 = TimeZone::operator==((TimeZone *)this,that), UVar2 == '\0')) ||
       (iVar3 = (*(this->fInitialRule->super_TimeZoneRule).super_UObject._vptr_UObject[5])
                          (this->fInitialRule,that[1].super_UObject._vptr_UObject),
       (char)iVar3 != '\0')) ||
      ((UVar2 = compareRules(this->fHistoricRules,
                             (UVector *)that[1].fID.super_Replaceable.super_UObject._vptr_UObject),
       UVar2 == '\0' ||
       (UVar2 = compareRules(this->fFinalRules,*(UVector **)&that[1].fID.fUnion), UVar2 == '\0')))))
     ) {
    UVar4 = '\0';
  }
  return UVar4;
}

Assistant:

UBool
RuleBasedTimeZone::operator==(const TimeZone& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)
        || BasicTimeZone::operator==(that) == FALSE) {
        return FALSE;
    }
    RuleBasedTimeZone *rbtz = (RuleBasedTimeZone*)&that;
    if (*fInitialRule != *(rbtz->fInitialRule)) {
        return FALSE;
    }
    if (compareRules(fHistoricRules, rbtz->fHistoricRules)
        && compareRules(fFinalRules, rbtz->fFinalRules)) {
        return TRUE;
    }
    return FALSE;
}